

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O1

int mbedtls_mpi_shrink(mbedtls_mpi *X,size_t nblimbs)

{
  ulong uVar1;
  mbedtls_mpi_uint *__src;
  int iVar2;
  ulong uVar3;
  mbedtls_mpi_uint *__dest;
  long lVar4;
  ulong uVar5;
  
  uVar1 = X->n;
  if (uVar1 <= nblimbs) {
    iVar2 = mbedtls_mpi_grow(X,nblimbs);
    return iVar2;
  }
  uVar3 = uVar1 + 1;
  do {
    if (uVar3 == 2) {
      uVar5 = 1;
      break;
    }
    uVar5 = uVar3 - 1;
    lVar4 = uVar3 - 2;
    uVar3 = uVar5;
  } while (X->p[lVar4] == 0);
  if (nblimbs < uVar5) {
    nblimbs = uVar5;
  }
  __dest = (mbedtls_mpi_uint *)calloc(nblimbs,8);
  if (__dest == (mbedtls_mpi_uint *)0x0) {
    iVar2 = -0x10;
  }
  else {
    __src = X->p;
    if (__src != (mbedtls_mpi_uint *)0x0) {
      memcpy(__dest,__src,nblimbs * 8);
      if (uVar1 << 3 != 0) {
        lVar4 = 0;
        do {
          *(undefined1 *)((long)__src + lVar4) = 0;
          lVar4 = lVar4 + 1;
        } while (uVar1 << 3 != lVar4);
      }
      free(X->p);
    }
    X->n = nblimbs;
    X->p = __dest;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int mbedtls_mpi_shrink( mbedtls_mpi *X, size_t nblimbs )
{
    mbedtls_mpi_uint *p;
    size_t i;

    /* Actually resize up in this case */
    if( X->n <= nblimbs )
        return( mbedtls_mpi_grow( X, nblimbs ) );

    for( i = X->n - 1; i > 0; i-- )
        if( X->p[i] != 0 )
            break;
    i++;

    if( i < nblimbs )
        i = nblimbs;

    if( ( p = mbedtls_calloc( i, ciL ) ) == NULL )
        return( MBEDTLS_ERR_MPI_ALLOC_FAILED );

    if( X->p != NULL )
    {
        memcpy( p, X->p, i * ciL );
        mbedtls_zeroize( X->p, X->n * ciL );
        mbedtls_free( X->p );
    }

    X->n = i;
    X->p = p;

    return( 0 );
}